

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void env_put(char *identifer,int line,Object value,Environment *env)

{
  undefined8 uVar1;
  Object o;
  anon_union_56_5_db8a5e08_for_Object_1 aVar2;
  Record *pRVar3;
  
  pRVar3 = env_match(identifer,env);
  if (pRVar3 == (Record *)0x0) {
    rec_new(identifer,value,env);
    return;
  }
  if ((pRVar3->object).type == OBJECT_ARRAY) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Array cannot be assigned directly!\x1b[0m",line);
    stop();
  }
  uVar1 = *(undefined8 *)&pRVar3->object;
  aVar2 = (pRVar3->object).field_1;
  if (value.type == OBJECT_INSTANCE) {
    if ((value.field_1.instance)->fromReturn == 1) {
      (value.field_1.instance)->fromReturn = 0;
    }
    (value.field_1.instance)->refCount = (value.field_1.instance)->refCount + 1;
  }
  *(Statement **)((long)&(pRVar3->object).field_1 + 0x28) =
       value.field_1.container.constructor.statements;
  *(Statement **)((long)&(pRVar3->object).field_1 + 0x30) = value.field_1.routine.code.statements;
  (pRVar3->object).field_1.routine.arguments = value.field_1.routine.arguments;
  *(undefined8 *)((long)&(pRVar3->object).field_1 + 0x20) = value.field_1._32_8_;
  (pRVar3->object).field_1.literal.field_2 = value.field_1.literal.field_2;
  *(undefined8 *)((long)&(pRVar3->object).field_1 + 0x10) = value.field_1._16_8_;
  *(long *)&pRVar3->object = value._0_8_;
  (pRVar3->object).field_1.instance = value.field_1.instance;
  if ((int)uVar1 == 5) {
    o.field_1._48_4_ = 5;
    o._0_56_ = aVar2;
    o.field_1._52_4_ = (int)((ulong)uVar1 >> 0x20);
    gc_obj(o);
  }
  return;
}

Assistant:

void env_put(char* identifer, int line, Object value, Environment *env){
    Record *get = env_match(identifer, env);
    if(get == NULL)
        rec_new(identifer, value, env);
    else if(get->object.type == OBJECT_ARRAY){
        printf(runtime_error("Array cannot be assigned directly!"), line);
        stop();
    }
    else{
        Object old = get->object;
        incr_ref(value);
        get->object = value;
        if(old.type == OBJECT_INSTANCE){
            gc_obj(old);
            //            printf(debug("[Put] Reassigning %s! Decremented refcount of %s#%d to %d!"),
            //                    identifer, get->object.instance->name, get->object.instance->insCount,
            //                    get->object.instance->refCount);
        }
    }
}